

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

void * rw::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  undefined1 auVar1 [16];
  ObjPipeline *pOVar2;
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  pOVar2 = ObjPipeline::create();
  DAT_0014a298 = pOVar2;
  (pOVar2->super_Pipeline).pluginID = 0;
  auVar1 = _DAT_001338e0;
  (pOVar2->super_Pipeline).pluginData = 0;
  lVar3 = 2;
  auVar4 = _DAT_00133ef0;
  do {
    if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffffff3) {
      *(ObjPipeline **)(&MatFX::modulateEnvMap + lVar3 * 2) = pOVar2;
      *(ObjPipeline **)(&matFXGlobals + lVar3 * 2) = pOVar2;
    }
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x10);
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	// init dummy pipelines
	matFXGlobals.dummypipe = ObjPipeline::create();
	matFXGlobals.dummypipe->pluginID = 0; //ID_MATFX;
	matFXGlobals.dummypipe->pluginData = 0;
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		matFXGlobals.pipelines[i] = matFXGlobals.dummypipe;
	return o;
}